

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_loop_filter_frame_init(AV1_COMMON *cm,int plane_start,int plane_end)

{
  uint8_t (*paauVar1) [8] [2];
  byte bVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int dir;
  long lVar6;
  uint8_t uVar7;
  long lVar8;
  uint8_t (*pauVar9) [2];
  uint8_t (*pauVar10) [2];
  uint8_t (*pauVar11) [2];
  long lVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar16 [16];
  uint8_t (*local_80) [2];
  int filt_lvl_r [3];
  int filt_lvl [3];
  
  update_sharpness(&cm->lf_info,(cm->lf).sharpness_level);
  filt_lvl[0] = (cm->lf).filter_level[0];
  filt_lvl[1] = (cm->lf).filter_level_u;
  filt_lvl[2] = (cm->lf).filter_level_v;
  filt_lvl_r[0] = (cm->lf).filter_level[1];
  filt_lvl_r[1] = filt_lvl[1];
  filt_lvl_r[2] = filt_lvl[2];
  lVar12 = (long)plane_start;
  local_80 = (cm->lf_info).lvl[lVar12][0][0] + 1;
  for (; (lVar12 < plane_end && ((lVar12 != 0 || filt_lvl[0] != 0) || filt_lvl_r[0] != 0));
      lVar12 = lVar12 + 1) {
    if ((lVar12 != 1 || filt_lvl[1] != 0) && (lVar12 != 2 || filt_lvl[2] != 0)) {
      pauVar9 = local_80;
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        pauVar10 = pauVar9;
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          piVar3 = filt_lvl_r;
          if (lVar6 == 0) {
            piVar3 = filt_lvl;
          }
          uVar14 = piVar3[lVar12];
          if (((cm->seg).enabled != '\0') &&
             (((cm->seg).feature_mask[lVar5] >> (seg_lvl_lf_lut[lVar12][lVar6] & 0x1f) & 1) != 0)) {
            uVar13 = uVar14 + (int)(cm->seg).feature_data[lVar5]
                                   [(uint)seg_lvl_lf_lut[lVar12][lVar6]];
            uVar14 = 0x3f;
            if (uVar13 < 0x3f) {
              uVar14 = uVar13;
            }
            if ((int)uVar13 < 0) {
              uVar14 = 0;
            }
          }
          if ((cm->lf).mode_ref_delta_enabled == '\0') {
            uVar19 = (undefined1)(uVar14 >> 0x18);
            uVar18 = (undefined1)(uVar14 >> 0x10);
            uVar17 = (undefined1)(uVar14 >> 8);
            auVar16._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar19,uVar19),uVar18),CONCAT14(uVar18,uVar14)) >>
                      0x20);
            auVar16[3] = uVar17;
            auVar16[2] = uVar17;
            auVar16[0] = (undefined1)uVar14;
            auVar16[1] = auVar16[0];
            auVar16._8_8_ = 0;
            auVar16 = pshuflw(auVar16,auVar16,0);
            uVar15 = auVar16._0_4_;
            paauVar1 = (cm->lf_info).lvl[lVar12][lVar5] + lVar6;
            *(undefined4 *)*paauVar1 = uVar15;
            *(undefined4 *)(*paauVar1 + 2) = uVar15;
            *(undefined4 *)(*paauVar1 + 4) = uVar15;
            *(undefined4 *)(*paauVar1 + 6) = uVar15;
          }
          else {
            bVar2 = (byte)((int)uVar14 >> 5);
            uVar13 = ((int)(cm->lf).ref_deltas[0] << (bVar2 & 0x1f)) + uVar14;
            uVar7 = '?';
            if (uVar13 < 0x3f) {
              uVar7 = (uint8_t)uVar13;
            }
            if ((int)uVar13 < 0) {
              uVar7 = '\0';
            }
            (cm->lf_info).lvl[lVar12][lVar5][lVar6][0][0] = uVar7;
            pauVar11 = pauVar10;
            for (lVar8 = 1; lVar8 != 8; lVar8 = lVar8 + 1) {
              for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
                uVar13 = ((int)(cm->lf).mode_deltas[lVar4] + (int)(cm->lf).ref_deltas[lVar8] <<
                         (bVar2 & 0x1f)) + uVar14;
                uVar7 = '?';
                if (uVar13 < 0x3f) {
                  uVar7 = (uint8_t)uVar13;
                }
                if ((int)uVar13 < 0) {
                  uVar7 = '\0';
                }
                (*pauVar11)[lVar4] = uVar7;
              }
              pauVar11 = pauVar11 + 1;
            }
          }
          pauVar10 = pauVar10 + 8;
        }
        pauVar9 = pauVar9 + 0x10;
      }
    }
    local_80 = local_80 + 0x80;
  }
  return;
}

Assistant:

void av1_loop_filter_frame_init(AV1_COMMON *cm, int plane_start,
                                int plane_end) {
  int filt_lvl[MAX_MB_PLANE], filt_lvl_r[MAX_MB_PLANE];
  int plane;
  int seg_id;
  // n_shift is the multiplier for lf_deltas
  // the multiplier is 1 for when filter_lvl is between 0 and 31;
  // 2 when filter_lvl is between 32 and 63
  loop_filter_info_n *const lfi = &cm->lf_info;
  struct loopfilter *const lf = &cm->lf;
  const struct segmentation *const seg = &cm->seg;

  // update sharpness limits
  update_sharpness(lfi, lf->sharpness_level);

  filt_lvl[0] = cm->lf.filter_level[0];
  filt_lvl[1] = cm->lf.filter_level_u;
  filt_lvl[2] = cm->lf.filter_level_v;

  filt_lvl_r[0] = cm->lf.filter_level[1];
  filt_lvl_r[1] = cm->lf.filter_level_u;
  filt_lvl_r[2] = cm->lf.filter_level_v;

  assert(plane_start >= AOM_PLANE_Y);
  assert(plane_end <= MAX_MB_PLANE);

  for (plane = plane_start; plane < plane_end; plane++) {
    if (plane == 0 && !filt_lvl[0] && !filt_lvl_r[0])
      break;
    else if (plane == 1 && !filt_lvl[1])
      continue;
    else if (plane == 2 && !filt_lvl[2])
      continue;

    for (seg_id = 0; seg_id < MAX_SEGMENTS; seg_id++) {
      for (int dir = 0; dir < 2; ++dir) {
        int lvl_seg = (dir == 0) ? filt_lvl[plane] : filt_lvl_r[plane];
        const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir];
        if (segfeature_active(seg, seg_id, seg_lf_feature_id)) {
          const int data = get_segdata(&cm->seg, seg_id, seg_lf_feature_id);
          lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
        }

        if (!lf->mode_ref_delta_enabled) {
          // we could get rid of this if we assume that deltas are set to
          // zero when not in use; encoder always uses deltas
          memset(lfi->lvl[plane][seg_id][dir], lvl_seg,
                 sizeof(lfi->lvl[plane][seg_id][dir]));
        } else {
          int ref, mode;
          const int scale = 1 << (lvl_seg >> 5);
          const int intra_lvl = lvl_seg + lf->ref_deltas[INTRA_FRAME] * scale;
          lfi->lvl[plane][seg_id][dir][INTRA_FRAME][0] =
              clamp(intra_lvl, 0, MAX_LOOP_FILTER);

          for (ref = LAST_FRAME; ref < REF_FRAMES; ++ref) {
            for (mode = 0; mode < MAX_MODE_LF_DELTAS; ++mode) {
              const int inter_lvl = lvl_seg + lf->ref_deltas[ref] * scale +
                                    lf->mode_deltas[mode] * scale;
              lfi->lvl[plane][seg_id][dir][ref][mode] =
                  clamp(inter_lvl, 0, MAX_LOOP_FILTER);
            }
          }
        }
      }
    }
  }
}